

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkIsTopoOrder(Cba_Ntk_t *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Bit_t *p_00;
  int iVar6;
  
  p_00 = Vec_BitStart((p->vObjType).nSize);
  for (iVar6 = 0; iVar6 < (p->vInputs).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vInputs,iVar6);
    Vec_BitWriteEntry(p_00,iVar2,1);
  }
  for (iVar6 = 0; iVar6 < (p->vSeq).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vSeq,iVar6);
    Vec_BitWriteEntry(p_00,iVar2,1);
  }
  for (iVar6 = 1; bVar1 = true, iVar6 < (p->vObjType).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Cba_ObjIsBox(p,iVar6);
    if ((iVar2 != 0) && (iVar2 = Cba_ObjIsSeq(p,iVar6), iVar2 == 0)) {
      iVar2 = Cba_ObjFin0(p,iVar6);
      for (; iVar3 = Cba_ObjFin0(p,iVar6 + 1), iVar2 < iVar3; iVar2 = iVar2 + 1) {
        iVar3 = Cba_FinFon(p,iVar2);
        iVar3 = Cba_FonObj(p,iVar3);
        if ((iVar3 != 0) && (iVar3 = Vec_BitEntry(p_00,iVar3), iVar3 == 0)) {
          bVar1 = false;
        }
      }
      if (!bVar1) goto LAB_0034e1e4;
      Vec_BitWriteEntry(p_00,iVar6,1);
    }
  }
  iVar6 = 0;
  do {
    if ((p->vOutputs).nSize <= iVar6) {
      iVar6 = 0;
      goto LAB_0034e177;
    }
    iVar2 = Vec_IntEntry(&p->vOutputs,iVar6);
    iVar3 = Cba_ObjFin0(p,iVar2);
    bVar1 = true;
    for (; iVar4 = Cba_ObjFin0(p,iVar2 + 1), iVar3 < iVar4; iVar3 = iVar3 + 1) {
      iVar4 = Cba_FinFon(p,iVar3);
      iVar4 = Cba_FonObj(p,iVar4);
      if ((iVar4 != 0) && (iVar4 = Vec_BitEntry(p_00,iVar4), iVar4 == 0)) {
        bVar1 = false;
      }
    }
    iVar6 = iVar6 + 1;
  } while (bVar1);
  goto LAB_0034e1e4;
LAB_0034e177:
  do {
    iVar2 = 1;
    if ((p->vSeq).nSize <= iVar6) goto LAB_0034e1e6;
    iVar3 = Vec_IntEntry(&p->vSeq,iVar6);
    iVar4 = Cba_ObjFin0(p,iVar3);
    for (; iVar5 = Cba_ObjFin0(p,iVar3 + 1), iVar4 < iVar5; iVar4 = iVar4 + 1) {
      iVar5 = Cba_FinFon(p,iVar4);
      iVar5 = Cba_FonObj(p,iVar5);
      if ((iVar5 != 0) && (iVar5 = Vec_BitEntry(p_00,iVar5), iVar5 == 0)) {
        iVar2 = 0;
      }
    }
    iVar6 = iVar6 + 1;
  } while (iVar2 != 0);
LAB_0034e1e4:
  iVar2 = 0;
LAB_0034e1e6:
  Vec_BitFree(p_00);
  return iVar2;
}

Assistant:

int Cba_NtkIsTopoOrder( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin, fTopo = 1;
    Vec_Bit_t * vVisited = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    // mark PIs and seq objects
    Cba_NtkForEachPi( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    // visit combinational nodes
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
        {
            Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
                if ( !Vec_BitEntry(vVisited, iFanin) )
                    fTopo = 0;
            if ( !fTopo )
                break;
            Vec_BitWriteEntry( vVisited, iObj, 1 );
        }
    // visit POs and seq objects
    if ( fTopo )
    Cba_NtkForEachPo( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    if ( fTopo )
    Cba_NtkForEachBoxSeq( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    Vec_BitFree( vVisited );
    return fTopo;
}